

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to8.h
# Opt level: O2

void ncnn::im2col_sgemm_pack4to8_avx
               (Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  int *piVar28;
  _func_int ***ppp_Var29;
  ulong uVar30;
  long lVar31;
  ulong uVar32;
  undefined1 (*pauVar33) [32];
  uint uVar34;
  long lVar35;
  undefined1 (*pauVar36) [32];
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  float *pfVar40;
  int q;
  ulong uVar41;
  int iVar42;
  undefined1 (*pauVar43) [16];
  long lVar45;
  ulong uVar46;
  bool bVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 local_b8 [64];
  size_t local_78;
  ulong local_70;
  ulong local_68;
  void *local_60;
  float zeros [8];
  ulong uVar44;
  
  uVar4 = bottom_im2col->w;
  uVar46 = (ulong)(int)uVar4;
  uVar5 = bottom_im2col->h;
  uVar38 = bottom_im2col->c;
  local_68 = (ulong)(uint)top_blob->c;
  local_60 = _bias->data;
  local_78 = 0;
  local_b8._0_8_ = (Allocator *)0x0;
  local_b8._8_4_ = 0;
  local_b8._12_4_ = 0;
  local_b8._16_8_ = SUB168(ZEXT816(0) << 0x40,4);
  local_b8._24_4_ = 0;
  uVar34 = uVar5 * 8;
  if ((long)uVar46 < 8) {
    uVar34 = uVar5;
  }
  local_b8._48_12_ = SUB1612(ZEXT816(0) << 0x40,4);
  uVar37 = (uVar4 & 7) + (uVar4 >> 3);
  if ((long)uVar46 < 8) {
    uVar37 = uVar4;
  }
  local_b8._32_8_ = local_b8._0_8_;
  local_b8._40_4_ = local_b8._8_4_;
  local_b8._44_4_ = local_b8._12_4_;
  Mat::create((Mat *)local_b8,uVar34,uVar38,uVar37,0x10,4,opt->workspace_allocator);
  uVar30 = 0;
  uVar34 = 0;
  if (0 < (int)uVar5) {
    uVar34 = uVar5;
  }
  uVar39 = 0;
  if (0 < (int)uVar38) {
    uVar39 = (ulong)uVar38;
  }
  uVar32 = (ulong)(uint)((int)uVar4 >> 3);
  if ((int)uVar4 >> 3 < 1) {
    uVar32 = uVar30;
  }
  lVar35 = (long)(int)(uVar4 * 4) * 4;
  lVar31 = 0x40;
  for (; uVar30 != uVar32; uVar30 = uVar30 + 1) {
    ppp_Var29 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ + local_78 * uVar30 * local_b8._16_8_);
    for (uVar41 = 0; uVar41 != uVar39; uVar41 = uVar41 + 1) {
      pauVar43 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar41 + lVar31);
      uVar37 = uVar34;
      while (bVar47 = uVar37 != 0, uVar37 = uVar37 - 1, bVar47) {
        auVar12 = vunpcklps_avx(pauVar43[-4],pauVar43[-3]);
        auVar13 = vunpcklps_avx(pauVar43[-2],pauVar43[-1]);
        auVar8 = vunpckhps_avx(pauVar43[-4],pauVar43[-3]);
        auVar9 = vunpckhps_avx(pauVar43[-2],pauVar43[-1]);
        auVar6 = vmovlhps_avx(auVar12,auVar13);
        auVar13 = vunpckhpd_avx(auVar12,auVar13);
        auVar12 = vmovlhps_avx(auVar8,auVar9);
        auVar7 = vunpckhpd_avx(auVar8,auVar9);
        auVar9 = vunpcklps_avx(*pauVar43,pauVar43[1]);
        auVar14 = vunpcklps_avx(pauVar43[2],pauVar43[3]);
        auVar10 = vunpckhps_avx(*pauVar43,pauVar43[1]);
        auVar11 = vunpckhps_avx(pauVar43[2],pauVar43[3]);
        auVar8 = vmovlhps_avx(auVar9,auVar14);
        auVar14 = vunpckhpd_avx(auVar9,auVar14);
        auVar9 = vmovlhps_avx(auVar10,auVar11);
        auVar10 = vunpckhpd_avx(auVar10,auVar11);
        *(undefined1 (*) [16])ppp_Var29 = auVar6;
        *(undefined1 (*) [16])(ppp_Var29 + 2) = auVar8;
        *(undefined1 (*) [16])(ppp_Var29 + 4) = auVar13;
        *(undefined1 (*) [16])(ppp_Var29 + 6) = auVar14;
        *(undefined1 (*) [16])(ppp_Var29 + 8) = auVar12;
        *(undefined1 (*) [16])(ppp_Var29 + 10) = auVar9;
        *(undefined1 (*) [16])(ppp_Var29 + 0xc) = auVar7;
        *(undefined1 (*) [16])(ppp_Var29 + 0xe) = auVar10;
        ppp_Var29 = ppp_Var29 + 0x10;
        pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar35);
      }
    }
    lVar31 = lVar31 + 0x80;
  }
  uVar30 = uVar46 & 0xfffffffffffffff8;
  lVar31 = uVar30 << 4;
  for (; (long)uVar30 < (long)uVar46; uVar30 = uVar30 + 1) {
    uVar32 = (ulong)(uint)((int)uVar30 >> 0x1f) << 0x20 | uVar30 & 0xffffffff;
    ppp_Var29 = (_func_int ***)
                ((long)(_func_int ***)local_b8._0_8_ +
                (long)((int)((long)uVar32 % 8) + (int)((long)uVar32 / 8)) * local_78 *
                local_b8._16_8_);
    for (uVar32 = 0; uVar32 != uVar39; uVar32 = uVar32 + 1) {
      pauVar43 = (undefined1 (*) [16])
                 ((long)bottom_im2col->data +
                 bottom_im2col->cstep * bottom_im2col->elemsize * uVar32 + lVar31);
      uVar37 = uVar34;
      while (bVar47 = uVar37 != 0, uVar37 = uVar37 - 1, bVar47) {
        *(undefined1 (*) [16])ppp_Var29 = *pauVar43;
        ppp_Var29 = ppp_Var29 + 2;
        pauVar43 = (undefined1 (*) [16])(*pauVar43 + lVar35);
      }
    }
    lVar31 = lVar31 + 0x10;
  }
  uVar39 = 0;
  uVar30 = (ulong)(uVar38 * uVar5 * 4);
  if ((int)(uVar38 * uVar5 * 4) < 1) {
    uVar30 = uVar39;
  }
  uVar32 = local_68 & 0xffffffff;
  if ((int)local_68 < 1) {
    uVar32 = uVar39;
  }
  for (; uVar39 != uVar32; uVar39 = uVar39 + 1) {
    pauVar33 = (undefined1 (*) [32])
               (top_blob->cstep * uVar39 * top_blob->elemsize + (long)top_blob->data);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    zeros[4] = 0.0;
    zeros[5] = 0.0;
    zeros[6] = 0.0;
    zeros[7] = 0.0;
    pauVar36 = (undefined1 (*) [32])(uVar39 * 0x20 + (long)local_60);
    if (local_60 == (void *)0x0) {
      pauVar36 = (undefined1 (*) [32])zeros;
    }
    lVar31 = 0;
    uVar41 = 0;
    while( true ) {
      if ((long)uVar46 <= (long)(uVar41 | 7)) break;
      lVar35 = local_78 * local_b8._16_8_ * lVar31;
      auVar48 = *pauVar36;
      lVar45 = 0;
      uVar44 = uVar30;
      auVar50 = auVar48;
      auVar15 = auVar48;
      auVar16 = auVar48;
      auVar17 = auVar48;
      auVar18 = auVar48;
      auVar19 = auVar48;
      auVar20 = auVar48;
      while( true ) {
        iVar42 = (int)uVar44;
        uVar44 = (ulong)(iVar42 - 1);
        if (iVar42 == 0) break;
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar45 + lVar35);
        pfVar40 = (float *)((long)kernel->data + lVar45 + kernel->cstep * uVar39 * kernel->elemsize)
        ;
        fVar21 = *pfVar40;
        fVar22 = pfVar40[1];
        fVar23 = pfVar40[2];
        fVar24 = pfVar40[3];
        fVar25 = pfVar40[4];
        fVar26 = pfVar40[5];
        fVar27 = pfVar40[6];
        fVar2 = *(float *)((long)(_func_int ***)local_b8._0_8_ + lVar45 + lVar35 + 4);
        auVar49._0_4_ = fVar1 * fVar21 + auVar48._0_4_;
        auVar49._4_4_ = fVar1 * fVar22 + auVar48._4_4_;
        auVar49._8_4_ = fVar1 * fVar23 + auVar48._8_4_;
        auVar49._12_4_ = fVar1 * fVar24 + auVar48._12_4_;
        auVar49._16_4_ = fVar1 * fVar25 + auVar48._16_4_;
        auVar49._20_4_ = fVar1 * fVar26 + auVar48._20_4_;
        auVar49._24_4_ = fVar1 * fVar27 + auVar48._24_4_;
        auVar49._28_4_ = fVar1 + auVar48._28_4_;
        fVar3 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar45 + lVar35);
        auVar51._0_4_ = fVar2 * fVar21 + auVar50._0_4_;
        auVar51._4_4_ = fVar2 * fVar22 + auVar50._4_4_;
        auVar51._8_4_ = fVar2 * fVar23 + auVar50._8_4_;
        auVar51._12_4_ = fVar2 * fVar24 + auVar50._12_4_;
        auVar51._16_4_ = fVar2 * fVar25 + auVar50._16_4_;
        auVar51._20_4_ = fVar2 * fVar26 + auVar50._20_4_;
        auVar51._24_4_ = fVar2 * fVar27 + auVar50._24_4_;
        auVar51._28_4_ = fVar1 + auVar50._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 8))->_vptr_Allocator +
                          lVar45 + lVar35 + 4);
        auVar52._0_4_ = fVar3 * fVar21 + auVar15._0_4_;
        auVar52._4_4_ = fVar3 * fVar22 + auVar15._4_4_;
        auVar52._8_4_ = fVar3 * fVar23 + auVar15._8_4_;
        auVar52._12_4_ = fVar3 * fVar24 + auVar15._12_4_;
        auVar52._16_4_ = fVar3 * fVar25 + auVar15._16_4_;
        auVar52._20_4_ = fVar3 * fVar26 + auVar15._20_4_;
        auVar52._24_4_ = fVar3 * fVar27 + auVar15._24_4_;
        auVar52._28_4_ = fVar3 + auVar15._28_4_;
        fVar2 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar45 + lVar35);
        auVar53._0_4_ = fVar1 * fVar21 + auVar16._0_4_;
        auVar53._4_4_ = fVar1 * fVar22 + auVar16._4_4_;
        auVar53._8_4_ = fVar1 * fVar23 + auVar16._8_4_;
        auVar53._12_4_ = fVar1 * fVar24 + auVar16._12_4_;
        auVar53._16_4_ = fVar1 * fVar25 + auVar16._16_4_;
        auVar53._20_4_ = fVar1 * fVar26 + auVar16._20_4_;
        auVar53._24_4_ = fVar1 * fVar27 + auVar16._24_4_;
        auVar53._28_4_ = fVar1 + auVar16._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x10))->_vptr_Allocator +
                          lVar45 + lVar35 + 4);
        auVar54._0_4_ = fVar2 * fVar21 + auVar17._0_4_;
        auVar54._4_4_ = fVar2 * fVar22 + auVar17._4_4_;
        auVar54._8_4_ = fVar2 * fVar23 + auVar17._8_4_;
        auVar54._12_4_ = fVar2 * fVar24 + auVar17._12_4_;
        auVar54._16_4_ = fVar2 * fVar25 + auVar17._16_4_;
        auVar54._20_4_ = fVar2 * fVar26 + auVar17._20_4_;
        auVar54._24_4_ = fVar2 * fVar27 + auVar17._24_4_;
        auVar54._28_4_ = fVar2 + auVar17._28_4_;
        fVar2 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar45 + lVar35);
        auVar55._0_4_ = fVar1 * fVar21 + auVar18._0_4_;
        auVar55._4_4_ = fVar1 * fVar22 + auVar18._4_4_;
        auVar55._8_4_ = fVar1 * fVar23 + auVar18._8_4_;
        auVar55._12_4_ = fVar1 * fVar24 + auVar18._12_4_;
        auVar55._16_4_ = fVar1 * fVar25 + auVar18._16_4_;
        auVar55._20_4_ = fVar1 * fVar26 + auVar18._20_4_;
        auVar55._24_4_ = fVar1 * fVar27 + auVar18._24_4_;
        auVar55._28_4_ = fVar1 + auVar18._28_4_;
        fVar1 = *(float *)((long)&((Allocator *)(local_b8._0_8_ + 0x18))->_vptr_Allocator +
                          lVar45 + lVar35 + 4);
        auVar56._0_4_ = fVar2 * fVar21 + auVar19._0_4_;
        auVar56._4_4_ = fVar2 * fVar22 + auVar19._4_4_;
        auVar56._8_4_ = fVar2 * fVar23 + auVar19._8_4_;
        auVar56._12_4_ = fVar2 * fVar24 + auVar19._12_4_;
        auVar56._16_4_ = fVar2 * fVar25 + auVar19._16_4_;
        auVar56._20_4_ = fVar2 * fVar26 + auVar19._20_4_;
        auVar56._24_4_ = fVar2 * fVar27 + auVar19._24_4_;
        auVar56._28_4_ = fVar2 + auVar19._28_4_;
        auVar57._0_4_ = fVar1 * fVar21 + auVar20._0_4_;
        auVar57._4_4_ = fVar1 * fVar22 + auVar20._4_4_;
        auVar57._8_4_ = fVar1 * fVar23 + auVar20._8_4_;
        auVar57._12_4_ = fVar1 * fVar24 + auVar20._12_4_;
        auVar57._16_4_ = fVar1 * fVar25 + auVar20._16_4_;
        auVar57._20_4_ = fVar1 * fVar26 + auVar20._20_4_;
        auVar57._24_4_ = fVar1 * fVar27 + auVar20._24_4_;
        auVar57._28_4_ = fVar1 + auVar20._28_4_;
        lVar45 = lVar45 + 0x20;
        auVar48 = auVar49;
        auVar50 = auVar51;
        auVar15 = auVar52;
        auVar16 = auVar53;
        auVar17 = auVar54;
        auVar18 = auVar55;
        auVar19 = auVar56;
        auVar20 = auVar57;
      }
      *pauVar33 = auVar48;
      pauVar33[1] = auVar50;
      pauVar33[2] = auVar15;
      pauVar33[3] = auVar16;
      pauVar33[4] = auVar17;
      pauVar33[5] = auVar18;
      pauVar33[6] = auVar19;
      pauVar33[7] = auVar20;
      pauVar33 = pauVar33 + 8;
      uVar41 = uVar41 + 8;
      lVar31 = lVar31 + 1;
    }
    while (uVar38 = (uint)uVar41, (int)uVar38 < (int)uVar4) {
      pfVar40 = (float *)(kernel->cstep * uVar39 * kernel->elemsize + (long)kernel->data);
      auVar48 = *pauVar36;
      for (lVar31 = 0; (int)uVar30 != (int)lVar31; lVar31 = lVar31 + 1) {
        fVar1 = *(float *)((long)(_func_int ***)local_b8._0_8_ +
                          lVar31 * 4 +
                          local_78 * local_b8._16_8_ *
                          (ulong)((uVar38 & 7) + ((uint)(uVar41 >> 3) & 0x1fffffff)));
        auVar50._0_4_ = fVar1 * *pfVar40 + auVar48._0_4_;
        auVar50._4_4_ = fVar1 * pfVar40[1] + auVar48._4_4_;
        auVar50._8_4_ = fVar1 * pfVar40[2] + auVar48._8_4_;
        auVar50._12_4_ = fVar1 * pfVar40[3] + auVar48._12_4_;
        auVar50._16_4_ = fVar1 * pfVar40[4] + auVar48._16_4_;
        auVar50._20_4_ = fVar1 * pfVar40[5] + auVar48._20_4_;
        auVar50._24_4_ = fVar1 * pfVar40[6] + auVar48._24_4_;
        auVar50._28_4_ = fVar1 + auVar48._28_4_;
        pfVar40 = pfVar40 + 8;
        auVar48 = auVar50;
      }
      *pauVar33 = auVar48;
      pauVar33 = pauVar33 + 1;
      uVar41 = (ulong)(uVar38 + 1);
    }
  }
  piVar28 = (int *)CONCAT44(local_b8._12_4_,local_b8._8_4_);
  if (piVar28 != (int *)0x0) {
    LOCK();
    *piVar28 = *piVar28 + -1;
    UNLOCK();
    if (*piVar28 == 0) {
      local_70 = (ulong)uVar5;
      if ((Allocator *)local_b8._32_8_ == (Allocator *)0x0) {
        free((void *)local_b8._0_8_);
      }
      else {
        (*(*(_func_int ***)local_b8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

static void im2col_sgemm_pack4to8_avx(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    // Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);

    const int size = bottom_im2col.w;
    const int maxk = bottom_im2col.h;
    const int inch = bottom_im2col.c;

    const int outch = top_blob.c;

    const float* bias = _bias;

    // permute
    Mat tmp;
    if (size >= 8)
        tmp.create(8 * maxk, inch, size / 8 + size % 8, 16u, 4, opt.workspace_allocator);
    else
        tmp.create(maxk, inch, size, 16u, 4, opt.workspace_allocator);
    {
        int nn_size = size >> 3;
        int remain_size_start = 0;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 8;

            float* tmpptr = tmp.channel(i / 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    // transpose 4x8
                    __m128 _r0 = _mm_load_ps(img0);
                    __m128 _r1 = _mm_load_ps(img0 + 4);
                    __m128 _r2 = _mm_load_ps(img0 + 4 * 2);
                    __m128 _r3 = _mm_load_ps(img0 + 4 * 3);
                    __m128 _r4 = _mm_load_ps(img0 + 4 * 4);
                    __m128 _r5 = _mm_load_ps(img0 + 4 * 5);
                    __m128 _r6 = _mm_load_ps(img0 + 4 * 6);
                    __m128 _r7 = _mm_load_ps(img0 + 4 * 7);

                    _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                    _MM_TRANSPOSE4_PS(_r4, _r5, _r6, _r7);

                    _mm_store_ps(tmpptr, _r0);
                    _mm_store_ps(tmpptr + 4, _r4);
                    _mm_store_ps(tmpptr + 4 * 2, _r1);
                    _mm_store_ps(tmpptr + 4 * 3, _r5);
                    _mm_store_ps(tmpptr + 4 * 4, _r2);
                    _mm_store_ps(tmpptr + 4 * 5, _r6);
                    _mm_store_ps(tmpptr + 4 * 6, _r3);
                    _mm_store_ps(tmpptr + 4 * 7, _r7);

                    img0 += size * 4;
                    tmpptr += 32;
                }
            }
        }

        remain_size_start += nn_size << 3;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);

            for (int q = 0; q < inch; q++)
            {
                const float* img0 = (const float*)bottom_im2col.channel(q) + i * 4;

                for (int k = 0; k < maxk; k++)
                {
                    __m128 _val = _mm_load_ps(img0);
                    _mm_store_ps(tmpptr, _val);

                    img0 += size * 4;
                    tmpptr += 4;
                }
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[8] = {0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 8 : zeros;

        int i = 0;
        for (; i + 7 < size; i += 8)
        {
            float* tmpptr = tmp.channel(i / 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);
            __m256 _sum1 = _sum0;
            __m256 _sum2 = _sum0;
            __m256 _sum3 = _sum0;
            __m256 _sum4 = _sum0;
            __m256 _sum5 = _sum0;
            __m256 _sum6 = _sum0;
            __m256 _sum7 = _sum0;

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);

                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                __m256 _val1 = _mm256_broadcast_ss(tmpptr + 1);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);
                _sum1 = _mm256_comp_fmadd_ps(_val1, _w0, _sum1);
                __m256 _val2 = _mm256_broadcast_ss(tmpptr + 2);
                __m256 _val3 = _mm256_broadcast_ss(tmpptr + 3);
                _sum2 = _mm256_comp_fmadd_ps(_val2, _w0, _sum2);
                _sum3 = _mm256_comp_fmadd_ps(_val3, _w0, _sum3);
                __m256 _val4 = _mm256_broadcast_ss(tmpptr + 4);
                __m256 _val5 = _mm256_broadcast_ss(tmpptr + 5);
                _sum4 = _mm256_comp_fmadd_ps(_val4, _w0, _sum4);
                _sum5 = _mm256_comp_fmadd_ps(_val5, _w0, _sum5);
                __m256 _val6 = _mm256_broadcast_ss(tmpptr + 6);
                __m256 _val7 = _mm256_broadcast_ss(tmpptr + 7);
                _sum6 = _mm256_comp_fmadd_ps(_val6, _w0, _sum6);
                _sum7 = _mm256_comp_fmadd_ps(_val7, _w0, _sum7);

                kptr += 8;
                tmpptr += 8;
            }

            _mm256_store_ps(outptr0, _sum0);
            _mm256_store_ps(outptr0 + 8, _sum1);
            _mm256_store_ps(outptr0 + 8 * 2, _sum2);
            _mm256_store_ps(outptr0 + 8 * 3, _sum3);
            _mm256_store_ps(outptr0 + 8 * 4, _sum4);
            _mm256_store_ps(outptr0 + 8 * 5, _sum5);
            _mm256_store_ps(outptr0 + 8 * 6, _sum6);
            _mm256_store_ps(outptr0 + 8 * 7, _sum7);

            outptr0 += 8 * 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 8 + i % 8);
            const float* kptr = kernel.channel(p);

            int nn = inch * maxk * 4; // inch always > 0

            __m256 _sum0 = _mm256_loadu_ps(biasptr);

            for (int j = 0; j < nn; j++)
            {
                __m256 _w0 = _mm256_load_ps(kptr);
                __m256 _val0 = _mm256_broadcast_ss(tmpptr);
                _sum0 = _mm256_comp_fmadd_ps(_val0, _w0, _sum0);

                kptr += 8;
                tmpptr += 1;
            }

            _mm256_store_ps(outptr0, _sum0);
            outptr0 += 8;
        }
    }
}